

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

Error __thiscall
asmjit::StringBuilder::_opNumber
          (StringBuilder *this,uint32_t op,uint64_t i,uint32_t base,size_t width,uint32_t flags)

{
  Error EVar1;
  char *__dest;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  size_t __n;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint64_t uVar8;
  ulong uVar9;
  char *__src;
  bool bVar10;
  bool bVar11;
  char buf [128];
  char local_3c [12];
  
  uVar5 = 10;
  if (0xffffffdc < base - 0x25) {
    uVar5 = base;
  }
  if ((long)i < 0 && (int)flags < 0) {
    cVar2 = '-';
    bVar11 = false;
    uVar8 = -i;
  }
  else {
    uVar8 = i;
    if ((flags & 1) == 0) {
      bVar11 = (flags & 2) == 0;
      cVar2 = (char)(flags & 2) << 4;
    }
    else {
      cVar2 = '+';
      bVar11 = false;
    }
  }
  uVar9 = (ulong)uVar5;
  uVar4 = 0;
  lVar7 = 0;
  do {
    lVar6 = lVar7;
    local_3c[lVar6 + 3] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar8 % uVar9];
    lVar7 = lVar6 + -1;
    uVar4 = uVar4 + 1;
    bVar10 = uVar9 <= uVar8;
    uVar8 = uVar8 / uVar9;
  } while (bVar10);
  __src = local_3c + lVar6 + 3;
  if ((flags & 4) != 0) {
    if (i != 0 && uVar5 == 8) {
      __src = local_3c + lVar6 + 2;
      *__src = '0';
    }
    if (uVar5 == 0x10) {
      __src[-2] = '0';
      __src[-1] = 'x';
      __src = __src + -2;
    }
  }
  if (!bVar11) {
    __src[-1] = cVar2;
    __src = __src + -1;
  }
  uVar9 = 0x100;
  if (width < 0x100) {
    uVar9 = width;
  }
  __n = uVar9 + lVar7;
  if (uVar9 < (ulong)-lVar7) {
    __n = 0;
  }
  sVar3 = uVar9 - uVar4;
  if (uVar9 < uVar4) {
    sVar3 = 0;
  }
  __dest = prepare(this,op,(size_t)(local_3c + sVar3 + -(long)__src + 4));
  if (__dest == (char *)0x0) {
    EVar1 = 1;
  }
  else {
    memcpy(__dest,__src,(size_t)(local_3c + lVar7 + -(long)__src + 4));
    memset(__dest + (long)(local_3c + (lVar7 - (long)__src) + 4),0x30,__n);
    if (width < uVar4) {
      uVar4 = width;
    }
    if (0xff < uVar4) {
      uVar4 = 0x100;
    }
    memcpy(__dest + (long)(local_3c + (uVar9 - uVar4) + (lVar7 - (long)__src) + 4),
           local_3c + lVar6 + 3,-lVar7);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error StringBuilder::_opNumber(uint32_t op, uint64_t i, uint32_t base, size_t width, uint32_t flags) noexcept {
  if (base < 2 || base > 36)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // --------------------------------------------------------------------------
  // [Sign]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatSigned) != 0 && static_cast<int64_t>(i) < 0) {
    i = static_cast<uint64_t>(-static_cast<int64_t>(i));
    sign = '-';
  }
  else if ((flags & kStringFormatShowSign) != 0) {
    sign = '+';
  }
  else if ((flags & kStringFormatShowSpace) != 0) {
    sign = ' ';
  }

  // --------------------------------------------------------------------------
  // [Number]
  // --------------------------------------------------------------------------

  do {
    uint64_t d = i / base;
    uint64_t r = i % base;

    *--p = StringBuilder_numbers[r];
    i = d;
  } while (i);

  size_t numberLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // --------------------------------------------------------------------------
  // [Alternate Form]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatAlternate) != 0) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // --------------------------------------------------------------------------
  // [Width]
  // --------------------------------------------------------------------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberLength)
    width = 0;
  else
    width -= numberLength;

  // --------------------------------------------------------------------------
  // Write]
  // --------------------------------------------------------------------------

  size_t prefixLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberLength;
  char* data = prepare(op, prefixLength + width + numberLength);

  if (!data)
    return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(data, p, prefixLength);
  data += prefixLength;

  ::memset(data, '0', width);
  data += width;

  ::memcpy(data, p + prefixLength, numberLength);
  return kErrorOk;
}